

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

char * absl::lts_20240722::StackString(void **pcs,int n,char *buf,int maxlen,bool symbolize)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  char *pcVar4;
  size_t count;
  int i;
  int len;
  char sym [200];
  bool symbolize_local;
  int maxlen_local;
  char *buf_local;
  int n_local;
  void **pcs_local;
  
  count._0_4_ = 0;
  sym[0xc3] = symbolize;
  sym._196_4_ = maxlen;
  for (count._4_4_ = 0; ((int)count != n && (count._4_4_ < (int)sym._196_4_));
      count._4_4_ = count._4_4_ + (int)sVar3) {
    iVar1 = sym._196_4_ - count._4_4_;
    if ((sym[0xc3] & 1U) == 0) {
      snprintf(buf + count._4_4_,(long)iVar1," %p",pcs[(int)count]);
    }
    else {
      uVar2 = absl::lts_20240722::Symbolize(pcs[(int)count],(char *)&i,200);
      if ((uVar2 & 1) == 0) {
        i._0_1_ = 0;
      }
      pcVar4 = "";
      if ((int)count == 0) {
        pcVar4 = "\n";
      }
      snprintf(buf + count._4_4_,(long)iVar1,"%s\t@ %p %s\n",pcVar4,pcs[(int)count],&i);
    }
    sVar3 = strlen(buf + count._4_4_);
    count._0_4_ = (int)count + 1;
  }
  return buf;
}

Assistant:

static char* StackString(void** pcs, int n, char* buf, int maxlen,
                         bool symbolize) {
  static constexpr int kSymLen = 200;
  char sym[kSymLen];
  int len = 0;
  for (int i = 0; i != n; i++) {
    if (len >= maxlen)
      return buf;
    size_t count = static_cast<size_t>(maxlen - len);
    if (symbolize) {
      if (!absl::Symbolize(pcs[i], sym, kSymLen)) {
        sym[0] = '\0';
      }
      snprintf(buf + len, count, "%s\t@ %p %s\n", (i == 0 ? "\n" : ""), pcs[i],
               sym);
    } else {
      snprintf(buf + len, count, " %p", pcs[i]);
    }
    len += strlen(&buf[len]);
  }
  return buf;
}